

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_c003::TestCheckArray2DCloseTrue::RunImpl(TestCheckArray2DCloseTrue *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_e8;
  int local_c4 [5];
  TestDetails local_b0;
  float local_8c;
  float local_88 [2];
  float array2 [3] [3];
  float local_58 [2];
  float array1 [3] [3];
  undefined1 local_28 [8];
  TestResults results;
  TestCheckArray2DCloseTrue *this_local;
  
  results._16_8_ = this;
  UnitTest::TestResults::TestResults((TestResults *)local_28,(TestReporter *)0x0);
  memcpy(local_58,&DAT_001638f0,0x24);
  memcpy(local_88,&DAT_00163920,0x24);
  local_8c = 0.02;
  UnitTest::TestDetails::TestDetails(&local_b0,"","","",0);
  UnitTest::CheckArray2DClose<float[3][3],float[3][3],float>
            ((TestResults *)local_28,(float (*) [3] [3])local_58,(float (*) [3] [3])local_88,3,3,
             &local_8c,&local_b0);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_c4[1] = 0;
  local_c4[0] = UnitTest::TestResults::GetFailureCount((TestResults *)local_28);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_e8,*ppTVar2,0xfb);
  UnitTest::CheckEqual<int,int>(results_00,local_c4 + 1,local_c4,&local_e8);
  return;
}

Assistant:

TEST(CheckArray2DCloseTrue)
{
    TestResults results;

    float const array1[3][3] = { { 1.0f, 1.5f, 2.0f },
                                 { 2.0f, 2.5f, 3.0f },
                                 { 3.0f, 3.5f, 4.0f } };
    float const array2[3][3] = { { 1.01f, 1.51f, 2.01f },
                                 { 2.01f, 2.51f, 3.01f },
                                 { 3.01f, 3.51f, 4.01f } };
    CheckArray2DClose(results, array1, array2, 3, 3, 0.02f, TestDetails("", "", "", 0));
    CHECK_EQUAL(0, results.GetFailureCount());
}